

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerTestObject.h
# Opt level: O0

RecyclerTestObject * BarrierObject<1001U,_50000U>::New(void)

{
  Recycler *pRVar1;
  BarrierObject<1001U,_50000U> *this;
  TrackAllocData local_38;
  uint local_c;
  uint count;
  
  local_c = GetRandomInteger(49000);
  pRVar1 = recyclerInstance;
  local_c = local_c + 0x3e9;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&BarrierObject<1001u,50000u>::typeinfo,(ulong)local_c << 3,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/GCStress/RecyclerTestObject.h"
             ,0xde);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_38);
  this = (BarrierObject<1001U,_50000U> *)new<Memory::Recycler>(0x18,pRVar1,0x220250,0);
  BarrierObject(this,local_c);
  return &this->super_RecyclerTestObject;
}

Assistant:

static RecyclerTestObject * New()
    {
        unsigned int count = minCount + GetRandomInteger(maxCount - minCount + 1);

        return RecyclerNewWithBarrierPlus(recyclerInstance, sizeof(RecyclerTestObject *) * count, BarrierObject, count);
    }